

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::findOrCreateLightSource(SemanticParser *this,SP *in)

{
  bool bVar1;
  __shared_ptr *this_00;
  __shared_ptr *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  SP SVar3;
  SP *in_stack_000000e0;
  SemanticParser *in_stack_000000e8;
  mapped_type *in_stack_ffffffffffffff88;
  shared_ptr<pbrt::LightSource> *in_stack_ffffffffffffff90;
  element_type *in_stack_ffffffffffffffc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffd0;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    this_00 = (__shared_ptr *)
              std::
              map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
              ::operator[]((map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
                            *)in_stack_ffffffffffffffd0._M_pi,(key_type *)in_stack_ffffffffffffffc8)
    ;
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (!bVar1) {
      in_stack_ffffffffffffff90 = (shared_ptr<pbrt::LightSource> *)&stack0xffffffffffffffc8;
      std::shared_ptr<pbrt::syntactic::LightSource>::shared_ptr
                ((shared_ptr<pbrt::syntactic::LightSource> *)in_stack_ffffffffffffff90,
                 (shared_ptr<pbrt::syntactic::LightSource> *)in_stack_ffffffffffffff88);
      createLightSourceFrom(in_stack_000000e8,in_stack_000000e0);
      in_stack_ffffffffffffff88 =
           std::
           map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
           ::operator[]((map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
                         *)in_stack_ffffffffffffffd0._M_pi,(key_type *)in_stack_ffffffffffffffc8);
      std::shared_ptr<pbrt::LightSource>::operator=
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      std::shared_ptr<pbrt::LightSource>::~shared_ptr((shared_ptr<pbrt::LightSource> *)0x1b1b7d);
      std::shared_ptr<pbrt::syntactic::LightSource>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::LightSource> *)0x1b1b87);
    }
    std::
    map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
    ::operator[]((map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
                  *)in_stack_ffffffffffffffd0._M_pi,(key_type *)in_stack_ffffffffffffffc8);
    std::shared_ptr<pbrt::LightSource>::shared_ptr
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<pbrt::LightSource>::shared_ptr((shared_ptr<pbrt::LightSource> *)0x1b1afa);
    _Var2._M_pi = extraout_RDX;
  }
  SVar3.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  SVar3.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar3.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

LightSource::SP SemanticParser::findOrCreateLightSource(pbrt::syntactic::LightSource::SP in)
  {
    if (!in)
      return LightSource::SP();

    if (!lightSourceMapping[in]) {
      lightSourceMapping[in] = createLightSourceFrom(in);
    }
    return lightSourceMapping[in];
  }